

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void pbrt::StatsReportPixelStart(Point2i *p)

{
  long lVar1;
  Tuple2<pbrt::Point2,_int> *pTVar2;
  undefined8 uVar3;
  
  if (pixelStatsEnabled == '\x01') {
    lVar1 = threadStatsState();
    if (*(char *)(lVar1 + 8) != '\0') {
      LogFatal<char_const(&)[33]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                 ,0x3d,"Check failed: %s",(char (*) [33])"threadStatsState.active == false");
    }
    lVar1 = threadStatsState();
    *(undefined1 *)(lVar1 + 8) = 1;
    pTVar2 = (Tuple2<pbrt::Point2,_int> *)threadStatsState();
    *pTVar2 = p->super_Tuple2<pbrt::Point2,_int>;
    uVar3 = std::chrono::_V2::steady_clock::now();
    lVar1 = threadStatsState();
    *(undefined8 *)(lVar1 + 0x10) = uVar3;
  }
  return;
}

Assistant:

void StatsReportPixelStart(const Point2i &p) {
    if (!pixelStatsEnabled)
        return;
    CHECK(threadStatsState.active == false);
    threadStatsState.active = true;
    threadStatsState.p = p;
    threadStatsState.start = std::chrono::steady_clock::now();
}